

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O1

CURLHcode curl_easy_header(CURL *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  Curl_llist *list;
  int iVar1;
  curl_header *h;
  size_t sVar2;
  Curl_llist_node *pCVar3;
  void *pvVar4;
  Curl_llist_node *n;
  Curl_easy *data;
  int iVar5;
  bool bVar6;
  void *local_68;
  Curl_llist_node *local_58;
  ulong local_50;
  
  h._0_4_ = CURLHE_BAD_ARGUMENT;
  h._0_4_ = CURLHE_BAD_ARGUMENT;
  if ((((-2 < request) && (h._0_4_ = (CURLHcode)h, 0xffffffe0 < type - 0x20)) &&
      (easy != (CURL *)0x0)) && ((name != (char *)0x0 && (hout != (curl_header **)0x0)))) {
    list = &(easy->state).httphdrs;
    sVar2 = Curl_llist_count(list);
    if (sVar2 == 0) {
      h._0_4_ = CURLHE_NOHEADERS;
    }
    else {
      iVar5 = (easy->state).requests;
      h._0_4_ = CURLHE_NOREQUEST;
      if (request <= iVar5) {
        if (request != -1) {
          iVar5 = request;
        }
        pCVar3 = Curl_llist_head(list);
        if (pCVar3 == (Curl_llist_node *)0x0) {
          local_58 = (Curl_llist_node *)0x0;
          local_50 = 0;
          pvVar4 = (void *)0x0;
          local_68 = (void *)0x0;
        }
        else {
          local_68 = (void *)0x0;
          local_50 = 0;
          local_58 = (Curl_llist_node *)0x0;
          do {
            pvVar4 = Curl_node_elem(pCVar3);
            iVar1 = curl_strequal(*(char **)((long)pvVar4 + 0x20),name);
            if (((iVar1 != 0) && ((*(byte *)((long)pvVar4 + 0x34) & type) != 0)) &&
               (*(int *)((long)pvVar4 + 0x30) == iVar5)) {
              local_50 = local_50 + 1;
              local_68 = pvVar4;
              local_58 = pCVar3;
            }
            pCVar3 = Curl_node_next(pCVar3);
          } while (pCVar3 != (Curl_llist_node *)0x0);
        }
        h._0_4_ = CURLHE_MISSING;
        if ((local_50 != 0) && (h._0_4_ = CURLHE_BADINDEX, nameindex < local_50)) {
          if (local_50 - 1 != nameindex) {
            n = Curl_llist_head(list);
            bVar6 = n == (Curl_llist_node *)0x0;
            pCVar3 = local_58;
            if (!bVar6) {
              local_68 = (void *)0x0;
              do {
                pvVar4 = Curl_node_elem(n);
                iVar1 = curl_strequal(*(char **)((long)pvVar4 + 0x20),name);
                if (((iVar1 != 0) && ((*(byte *)((long)pvVar4 + 0x34) & type) != 0)) &&
                   (*(int *)((long)pvVar4 + 0x30) == iVar5)) {
                  pCVar3 = n;
                  if (local_68 == (void *)nameindex) break;
                  local_68 = (void *)((long)local_68 + 1);
                }
                n = Curl_node_next(n);
                bVar6 = n == (Curl_llist_node *)0x0;
                pCVar3 = local_58;
              } while (!bVar6);
            }
            local_58 = pCVar3;
            local_68 = pvVar4;
            if (bVar6) {
              return CURLHE_MISSING;
            }
          }
          (easy->state).headerout[0].name = *(char **)((long)local_68 + 0x20);
          (easy->state).headerout[0].value = *(char **)((long)local_68 + 0x28);
          (easy->state).headerout[0].amount = local_50;
          (easy->state).headerout[0].index = nameindex;
          (easy->state).headerout[0].origin = *(byte *)((long)local_68 + 0x34) | 0x8000000;
          (easy->state).headerout[0].anchor = local_58;
          *hout = (easy->state).headerout;
          h._0_4_ = CURLHE_OK;
        }
      }
    }
  }
  return (CURLHcode)h;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    hs = Curl_node_elem(e);
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
      hs = Curl_node_elem(e);
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this should not happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(hs, nameindex, amount, e_pick,
                       &data->state.headerout[0]);
  *hout = &data->state.headerout[0];
  return CURLHE_OK;
}